

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.cpp
# Opt level: O3

Ptr __thiscall
TgBot::TgTypeParser::parseJsonAndGetInlineQueryResultVenue(TgTypeParser *this,ptree *data)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  self_type *psVar2;
  long *plVar3;
  optional<int> oVar4;
  int iVar5;
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  string *psVar7;
  type_conflict3 tVar8;
  Ptr PVar9;
  path_type local_d0;
  undefined1 local_a0 [8];
  dummy_u local_98;
  undefined1 *local_78;
  long local_70;
  undefined1 local_68 [16];
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  TgTypeParser *local_38;
  
  *(undefined8 *)this = 0;
  local_38 = this + 8;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<TgBot::InlineQueryResultVenue,std::allocator<TgBot::InlineQueryResultVenue>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_38,(InlineQueryResultVenue **)this,
             (allocator<TgBot::InlineQueryResultVenue> *)&local_d0);
  paVar1 = &local_d0.m_value.field_2;
  local_d0.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"latitude","");
  local_d0.m_separator = '.';
  local_d0.m_start._M_current = local_d0.m_value._M_dataplus._M_p;
  psVar2 = boost::property_tree::
           basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::get_child(in_RDX,&local_d0);
  std::locale::locale((locale *)local_58);
  std::locale::locale((locale *)local_a0,(locale *)local_58);
  tVar8 = boost::property_tree::
          basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
          get_value<float,boost::property_tree::stream_translator<char,std::char_traits<char>,std::allocator<char>,float>>
                    ((basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
                      *)psVar2,
                     (stream_translator<char,_std::char_traits<char>,_std::allocator<char>,_float> *
                     )local_a0);
  std::locale::~locale((locale *)local_a0);
  std::locale::~locale((locale *)local_58);
  *(type_conflict3 *)(*(long *)this + 0xa8) = tVar8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0.m_value._M_dataplus._M_p);
  }
  local_d0.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"longitude","");
  local_d0.m_separator = '.';
  local_d0.m_start._M_current = local_d0.m_value._M_dataplus._M_p;
  psVar2 = boost::property_tree::
           basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::get_child(in_RDX,&local_d0);
  std::locale::locale((locale *)local_58);
  std::locale::locale((locale *)local_a0,(locale *)local_58);
  tVar8 = boost::property_tree::
          basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
          get_value<float,boost::property_tree::stream_translator<char,std::char_traits<char>,std::allocator<char>,float>>
                    ((basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
                      *)psVar2,
                     (stream_translator<char,_std::char_traits<char>,_std::allocator<char>,_float> *
                     )local_a0);
  std::locale::~locale((locale *)local_a0);
  std::locale::~locale((locale *)local_58);
  *(type_conflict3 *)(*(long *)this + 0xac) = tVar8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0.m_value._M_dataplus._M_p);
  }
  local_d0.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"address","");
  local_d0.m_separator = '.';
  local_d0.m_start._M_current = local_d0.m_value._M_dataplus._M_p;
  psVar2 = boost::property_tree::
           basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::get_child(in_RDX,&local_d0);
  boost::property_tree::
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
  get_value<std::__cxx11::string,boost::property_tree::id_translator<std::__cxx11::string>>
            (local_a0,(basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
                       *)psVar2);
  std::__cxx11::string::operator=((string *)(*(long *)this + 0xb0),(string *)local_a0);
  if ((undefined1 *)CONCAT71(local_a0._1_7_,local_a0[0]) != local_a0 + 0x10) {
    operator_delete((undefined1 *)CONCAT71(local_a0._1_7_,local_a0[0]));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0.m_value._M_dataplus._M_p);
  }
  local_d0.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"foursquare_id","");
  local_d0.m_separator = '.';
  local_d0.m_start._M_current = local_d0.m_value._M_dataplus._M_p;
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
  boost::property_tree::
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
  get_optional<std::__cxx11::string>
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_a0,
             (basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
              *)in_RDX,&local_d0);
  psVar7 = (string *)&local_78;
  if (local_a0[0] != (locale)0x0) {
    psVar7 = (string *)(local_a0 + 8);
  }
  local_58[0] = local_48;
  plVar3 = &local_70;
  if (local_a0[0] != (locale)0x0) {
    plVar3 = (long *)(local_a0 + 0x10);
  }
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_58,*(long *)psVar7,*plVar3 + *(long *)psVar7);
  if ((local_a0[0] == (locale)0x1) && (local_98.aligner_ != (type)((long)local_a0 + 0x18))) {
    operator_delete((void *)local_98.aligner_);
  }
  std::__cxx11::string::operator=((string *)(*(long *)this + 0xd0),(string *)local_58);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0]);
  }
  if (local_78 != local_68) {
    operator_delete(local_78);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0.m_value._M_dataplus._M_p);
  }
  local_d0.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"foursquare_type","");
  local_d0.m_separator = '.';
  local_d0.m_start._M_current = local_d0.m_value._M_dataplus._M_p;
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
  boost::property_tree::
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
  get_optional<std::__cxx11::string>
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_a0,
             (basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
              *)in_RDX,&local_d0);
  local_58[0] = local_48;
  psVar7 = (string *)&local_78;
  if (local_a0[0] != (locale)0x0) {
    psVar7 = (string *)(local_a0 + 8);
  }
  plVar3 = &local_70;
  if (local_a0[0] != (locale)0x0) {
    plVar3 = (long *)(local_a0 + 0x10);
  }
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_58,*(long *)psVar7,*plVar3 + *(long *)psVar7);
  if ((local_a0[0] == (locale)0x1) && (local_98.aligner_ != (type)((long)local_a0 + 0x18))) {
    operator_delete((void *)local_98.aligner_);
  }
  std::__cxx11::string::operator=((string *)(*(long *)this + 0xf0),(string *)local_58);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0]);
  }
  if (local_78 != local_68) {
    operator_delete(local_78);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0.m_value._M_dataplus._M_p);
  }
  local_d0.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"thumb_url","");
  local_d0.m_separator = '.';
  local_d0.m_start._M_current = local_d0.m_value._M_dataplus._M_p;
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
  boost::property_tree::
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
  get_optional<std::__cxx11::string>
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_a0,
             (basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
              *)in_RDX,&local_d0);
  local_58[0] = local_48;
  psVar7 = (string *)&local_78;
  if (local_a0[0] != (locale)0x0) {
    psVar7 = (string *)(local_a0 + 8);
  }
  plVar3 = &local_70;
  if (local_a0[0] != (locale)0x0) {
    plVar3 = (long *)(local_a0 + 0x10);
  }
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_58,*(long *)psVar7,*plVar3 + *(long *)psVar7);
  if ((local_a0[0] == (locale)0x1) && (local_98.aligner_ != (type)((long)local_a0 + 0x18))) {
    operator_delete((void *)local_98.aligner_);
  }
  std::__cxx11::string::operator=((string *)(*(long *)this + 0x110),(string *)local_58);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0]);
  }
  if (local_78 != local_68) {
    operator_delete(local_78);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0.m_value._M_dataplus._M_p);
  }
  local_d0.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"thumb_width","");
  local_d0.m_separator = '.';
  local_d0.m_start._M_current = local_d0.m_value._M_dataplus._M_p;
  oVar4 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get_optional<int>(in_RDX,&local_d0);
  iVar5 = 0;
  if (((ulong)oVar4.super_type & 1) != 0) {
    iVar5 = oVar4.super_type.m_storage;
  }
  *(int *)(*(long *)this + 0x130) = iVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0.m_value._M_dataplus._M_p);
  }
  local_d0.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"thumb_height","");
  local_d0.m_separator = '.';
  local_d0.m_start._M_current = local_d0.m_value._M_dataplus._M_p;
  oVar4 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get_optional<int>(in_RDX,&local_d0);
  _Var6._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (((ulong)oVar4.super_type & 1) != 0) {
    _Var6._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((ulong)oVar4.super_type >> 0x20);
  }
  *(int *)(*(long *)this + 0x134) = (int)_Var6._M_pi;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0.m_value._M_dataplus._M_p);
    _Var6._M_pi = extraout_RDX;
  }
  PVar9.super___shared_ptr<TgBot::InlineQueryResultVenue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var6._M_pi;
  PVar9.super___shared_ptr<TgBot::InlineQueryResultVenue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Ptr)PVar9.super___shared_ptr<TgBot::InlineQueryResultVenue,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

InlineQueryResultVenue::Ptr TgTypeParser::parseJsonAndGetInlineQueryResultVenue(const boost::property_tree::ptree& data) const {
    // NOTE: This function will be called by parseJsonAndGgetInlineQueryResult().
    auto result(make_shared<InlineQueryResultVenue>());
    result->latitude = data.get<float>("latitude");
    result->longitude = data.get<float>("longitude");
    result->address = data.get<string>("address");
    result->foursquareId = data.get<string>("foursquare_id", "");
    result->foursquareType = data.get<string>("foursquare_type", "");
    result->thumbUrl = data.get<string>("thumb_url", "");
    result->thumbWidth = data.get<int32_t>("thumb_width", 0);
    result->thumbHeight = data.get<int32_t>("thumb_height", 0);
    return result;
}